

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

RequestBuilder * __thiscall
restincurl::RequestBuilder::Header(RequestBuilder *this,string *name,string *value)

{
  RequestBuilder *pRVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,name,": ");
  std::operator+(&local_58,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  pRVar1 = Header(this,local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  return pRVar1;
}

Assistant:

RequestBuilder& Header(const std::string& name,
                               const std::string& value) {
            const auto v = name + ": " + value;
            return Header(v.c_str());
        }